

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  HoleSet<unsigned_char> *this_00;
  NullableValue<unsigned_char> *other;
  uchar *puVar1;
  byte *pbVar2;
  uint locationOffset;
  Fault f_2;
  NullableValue<unsigned_char> hole;
  Fault f_1;
  Fault local_30;
  Fault f;
  uint result;
  uint lgSize_local;
  DataLocation *location_local;
  Group *group_local;
  DataLocationUsage *this_local;
  
  f.exception._4_4_ = lgSize;
  if ((this->isUsed & 1U) == 0) {
    if (location->lgSize < lgSize) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x146,FAILED,"lgSize <= location.lgSize",
                 "\"Did smallestHoleAtLeast() really find a hole?\"",
                 (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
      kj::_::Debug::Fault::fatal(&local_30);
    }
    f.exception._0_4_ = 0;
    this->isUsed = true;
    this->lgSizeUsed = (uchar)lgSize;
  }
  else if (lgSize < this->lgSizeUsed) {
    this_00 = (HoleSet<unsigned_char> *)((long)&f_2.exception + 4);
    HoleSet<unsigned_char>::tryAllocate(this_00,(char)this + '\x02');
    other = kj::_::readMaybe<unsigned_char>((Maybe<unsigned_char> *)this_00);
    kj::_::NullableValue<unsigned_char>::NullableValue
              ((NullableValue<unsigned_char> *)((long)&f_2.exception + 6),other);
    kj::Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)((long)&f_2.exception + 4));
    puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_char_
                       ((NullableValue *)((long)&f_2.exception + 6));
    if (puVar1 == (uchar *)0x0) {
      if (location->lgSize <= (uint)this->lgSizeUsed) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                  ((Fault *)&stack0xffffffffffffffa8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x158,FAILED,"lgSizeUsed < location.lgSize",
                   "\"Did smallestHoleAtLeast() really find a hole?\"",
                   (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
      }
      f.exception._0_4_ = 1 << (this->lgSizeUsed - (uchar)f.exception._4_4_ & 0x1f);
      HoleSet<unsigned_char>::addHolesAtEnd
                (&this->holes,(uchar)f.exception._4_4_,(char)(uint)f.exception + '\x01',
                 this->lgSizeUsed);
      this->lgSizeUsed = this->lgSizeUsed + '\x01';
    }
    else {
      pbVar2 = kj::_::NullableValue<unsigned_char>::operator*
                         ((NullableValue<unsigned_char> *)((long)&f_2.exception + 6));
      f.exception._0_4_ = (uint)*pbVar2;
    }
    kj::_::NullableValue<unsigned_char>::~NullableValue
              ((NullableValue<unsigned_char> *)((long)&f_2.exception + 6));
  }
  else {
    if (location->lgSize <= lgSize) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                ((Fault *)&stack0xffffffffffffffb8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x14d,FAILED,"lgSize < location.lgSize",
                 "\"Did smallestHoleAtLeast() really find a hole?\"",
                 (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffb8);
    }
    HoleSet<unsigned_char>::addHolesAtEnd(&this->holes,this->lgSizeUsed,'\x01',(uchar)lgSize);
    this->lgSizeUsed = (char)f.exception._4_4_ + '\x01';
    f.exception._0_4_ = 1;
  }
  return (location->offset << ((char)location->lgSize - (char)f.exception._4_4_ & 0x1fU)) +
         (uint)f.exception;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_MAYBE(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = *hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }